

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

void __thiscall asl::String::split(String *this,String *sep,Array<asl::String> *out)

{
  int iVar1;
  int iVar2;
  int j;
  int i0;
  String local_48;
  
  Array<asl::String>::clear(out);
  iVar1 = sep->_len;
  iVar2 = this->_len;
  i0 = 0;
  while (i0 <= iVar2) {
    j = indexOf(this,sep,i0);
    if (j == -1) {
      j = iVar2;
    }
    substring(&local_48,this,i0,j);
    Array<asl::String>::operator<<(out,&local_48);
    ~String(&local_48);
    i0 = j + iVar1;
  }
  return;
}

Assistant:

void String::split(const String& sep, Array<String>& out) const
{
	out.clear();
	int j=0, m=sep.length(), n=length();
	for(int i=0; i<=n; i=j+m)
	{
		j=indexOf(sep, i);
		if(j==-1) j=n;
		out << substring(i, j);
	}
}